

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O2

void bits2int(uECC_word_t *native,uint8_t *bits,uint bits_size,uECC_Curve curve)

{
  byte bVar1;
  cmpresult_t cVar2;
  uECC_word_t *puVar3;
  wordcount_t num_words;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  
  uVar4 = (curve->num_n_bits + 7) / 8;
  uVar6 = (long)(curve->num_n_bits + 0x3f) / 0x40 & 0xffffffff;
  if (uVar4 < bits_size) {
    bits_size = uVar4;
  }
  num_words = (wordcount_t)uVar6;
  uECC_vli_clear(native,num_words);
  uECC_vli_bytesToNative(native,bits,bits_size);
  iVar7 = bits_size * 8 - (int)curve->num_n_bits;
  if ((uint)(int)curve->num_n_bits <= bits_size * 8 && iVar7 != 0) {
    bVar1 = (byte)iVar7;
    uVar5 = 0;
    for (puVar3 = native + uVar6; native < puVar3; puVar3 = puVar3 + -1) {
      uVar6 = puVar3[-1] >> (bVar1 & 0x3f) | uVar5;
      uVar5 = puVar3[-1] << (0x40 - bVar1 & 0x3f);
      puVar3[-1] = uVar6;
    }
    cVar2 = uECC_vli_cmp_unsafe(curve->n,native,num_words);
    if (cVar2 != '\x01') {
      uECC_vli_sub(native,native,curve->n,num_words);
      return;
    }
  }
  return;
}

Assistant:

static void bits2int(uECC_word_t *native,
                     const uint8_t *bits,
                     unsigned bits_size,
                     uECC_Curve curve) {
    unsigned num_n_bytes = BITS_TO_BYTES(curve->num_n_bits);
    unsigned num_n_words = BITS_TO_WORDS(curve->num_n_bits);
    int shift;
    uECC_word_t carry;
    uECC_word_t *ptr;

    if (bits_size > num_n_bytes) {
        bits_size = num_n_bytes;
    }

    uECC_vli_clear(native, num_n_words);
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    bcopy((uint8_t *) native, bits, bits_size);
#else
    uECC_vli_bytesToNative(native, bits, bits_size);
#endif
    if (bits_size * 8 <= (unsigned)curve->num_n_bits) {
        return;
    }
    shift = bits_size * 8 - curve->num_n_bits;
    carry = 0;
    ptr = native + num_n_words;
    while (ptr-- > native) {
        uECC_word_t temp = *ptr;
        *ptr = (temp >> shift) | carry;
        carry = temp << (uECC_WORD_BITS - shift);
    }

    /* Reduce mod curve_n */
    if (uECC_vli_cmp_unsafe(curve->n, native, num_n_words) != 1) {
        uECC_vli_sub(native, native, curve->n, num_n_words);
    }
}